

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::iterate(PrimitiveRestartCase *this)

{
  RenderContext *pRVar1;
  int width;
  bool bVar2;
  deUint32 seed;
  int iVar3;
  int iVar4;
  GLuint GVar5;
  RenderTarget *pRVar6;
  char *description;
  int height;
  Surface resultImg;
  Surface referenceImg;
  PixelBufferAccess local_68;
  Random rnd;
  
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = pRVar6->m_width;
  if (0xff < pRVar6->m_width) {
    width = 0x100;
  }
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = 0x100;
  if (pRVar6->m_height < 0x100) {
    height = pRVar6->m_height;
  }
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar6->m_width;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = pRVar6->m_height;
  seed = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  iVar3 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar3 - width);
  iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar4 - height);
  tcu::Surface::Surface(&referenceImg,width,height);
  tcu::Surface::Surface(&resultImg,width,height);
  glwViewport(iVar3,iVar4,width,height);
  glwClearColor(0.0,0.0,0.0,1.0);
  GVar5 = (this->m_program->m_program).m_program;
  glwUseProgram(GVar5);
  GVar5 = glwGetAttribLocation(GVar5,"a_position");
  glwEnableVertexAttribArray(GVar5);
  glwVertexAttribPointer
            (GVar5,2,0x1406,'\0',0,
             (this->m_positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  renderWithRestart(this);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess(&local_68,&resultImg);
  glu::readPixels(pRVar1,iVar3,iVar4,&local_68);
  renderWithoutRestart(this);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess(&local_68,&referenceImg);
  glu::readPixels(pRVar1,iVar3,iVar4,&local_68);
  local_68.super_ConstPixelBufferAccess.m_format.order = R;
  bVar2 = tcu::pixelThresholdCompare
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "ComparisonResult","Image comparison result",&referenceImg,&resultImg,
                     (RGBA *)&local_68,COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,description
            );
  glwUseProgram(0);
  tcu::Surface::~Surface(&resultImg);
  tcu::Surface::~Surface(&referenceImg);
  return STOP;
}

Assistant:

PrimitiveRestartCase::IterateResult PrimitiveRestartCase::iterate (void)
{
	int							width			= deMin32(m_context.getRenderTarget().getWidth(), MAX_RENDER_WIDTH);
	int							height			= deMin32(m_context.getRenderTarget().getHeight(), MAX_RENDER_HEIGHT);

	int							xOffsetMax		= m_context.getRenderTarget().getWidth() - width;
	int							yOffsetMax		= m_context.getRenderTarget().getHeight() - height;

	de::Random					rnd				(deStringHash(getName()));

	int							xOffset			= rnd.getInt(0, xOffsetMax);
	int							yOffset			= rnd.getInt(0, yOffsetMax);
	tcu::Surface				referenceImg	(width, height);
	tcu::Surface				resultImg		(width, height);

	glViewport(xOffset, yOffset, width, height);
	glClearColor(0.0f, 0.0f, 0.0f, 1.0f);

	deUint32 program = m_program->getProgram();
	glUseProgram(program);

	// Setup position attribute.

	int loc = glGetAttribLocation(program, "a_position");
	glEnableVertexAttribArray(loc);
	glVertexAttribPointer(loc, 2, GL_FLOAT, GL_FALSE, 0, &m_positions[0]);

	// Render result.

	renderWithRestart();
	glu::readPixels(m_context.getRenderContext(), xOffset, yOffset, resultImg.getAccess());

	// Render reference (same scene as the real deal, but emulate primitive restart without actually using it).

	renderWithoutRestart();
	glu::readPixels(m_context.getRenderContext(), xOffset, yOffset, referenceImg.getAccess());

	// Compare.

	bool testOk = tcu::pixelThresholdCompare(m_testCtx.getLog(), "ComparisonResult", "Image comparison result", referenceImg, resultImg, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	m_testCtx.setTestResult(testOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							testOk ? "Pass"					: "Fail");

	glUseProgram(0);

	return STOP;
}